

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

void __thiscall Matrix<double>::Matrix(Matrix<double> *this,int a,int b)

{
  double **ppdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->n = a;
  this->m = b;
  uVar3 = (long)a * 8;
  if (a < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppdVar1 = (double **)operator_new__(uVar3);
  this->M = ppdVar1;
  if (0 < a) {
    uVar3 = (long)b << 3;
    if (b < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    uVar4 = 0;
    do {
      pdVar2 = (double *)operator_new__(uVar3);
      this->M[uVar4] = pdVar2;
      uVar4 = uVar4 + 1;
    } while ((uint)a != uVar4);
  }
  if (0 < a) {
    ppdVar1 = this->M;
    uVar3 = 0;
    do {
      if (0 < b) {
        memset(ppdVar1[uVar3],0,(ulong)(uint)b << 3);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)a != uVar3);
  }
  return;
}

Assistant:

Matrix(int a, int b) {
    n = a;
    m = b;
    M = new T*[n];
    for (int i = 0; i < n; i++) {
      M[i] = new T[m];
    }
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        M[i][j] = 0;
      }
    }
  }